

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O0

int coda_bin_cursor_read_uint8(coda_cursor *cursor,uint8_t *dst)

{
  ulong bit_offset_00;
  int iVar1;
  coda_type *local_80;
  char local_78 [8];
  char s2 [21];
  char local_58 [8];
  char s1 [21];
  int64_t bit_offset;
  int64_t bit_size;
  coda_type *type;
  uint8_t *dst_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_80 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_80 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  bit_size = (int64_t)local_80;
  bit_offset = local_80->bit_size;
  bit_offset_00 = cursor->stack[cursor->n + -1].bit_offset;
  type = (coda_type *)dst;
  dst_local = (uint8_t *)cursor;
  if (bit_offset == -1) {
    iVar1 = coda_bin_cursor_get_bit_size(cursor,&bit_offset);
    if (iVar1 != 0) {
      return -1;
    }
    if ((bit_offset < 0) || (8 < bit_offset)) {
      coda_str64(bit_offset,local_58);
      coda_str64(*(long *)(dst_local + (long)(*(int *)(dst_local + 8) + -1) * 0x18 + 0x20) >> 3,
                 local_78);
      coda_set_error(-300,
                     "possible product error detected (invalid bit size (%s) for binary uint8 integer - byte:bit offset = %s:%d)"
                     ,local_58,local_78,
                     (ulong)((uint)*(undefined8 *)
                                    (dst_local + (long)(*(int *)(dst_local + 8) + -1) * 0x18 + 0x20)
                            & 7));
      return -1;
    }
  }
  if (((bit_offset_00 & 7) == 0) && (bit_offset == 8)) {
    iVar1 = read_bytes(*(coda_product **)dst_local,(long)bit_offset_00 >> 3,1,type);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    if (1 < (bit_offset >> 3) + (long)(int)(uint)((bit_offset & 7U) != 0)) {
      __assert_fail("bit_size_to_byte_size(bit_size) <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin-cursor.c"
                    ,0xe9,"int coda_bin_cursor_read_uint8(const coda_cursor *, uint8_t *)");
    }
    *(undefined1 *)&type->format = coda_format_ascii;
    iVar1 = read_bits(*(coda_product **)dst_local,bit_offset_00,bit_offset,(uint8_t *)type);
    if (iVar1 != 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int coda_bin_cursor_read_uint8(const coda_cursor *cursor, uint8_t *dst)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_size = type->bit_size;
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;

    if (bit_size == -1)
    {
        if (coda_bin_cursor_get_bit_size(cursor, &bit_size) != 0)
        {
            return -1;
        }
        if (bit_size < 0 || bit_size > 8)
        {
            char s1[21];
            char s2[21];

            coda_str64(bit_size, s1);
            coda_str64(cursor->stack[cursor->n - 1].bit_offset >> 3, s2);
            coda_set_error(CODA_ERROR_PRODUCT,
                           "possible product error detected (invalid bit size (%s) for binary uint8 integer - "
                           "byte:bit offset = %s:%d)", s1, s2, (int)(cursor->stack[cursor->n - 1].bit_offset & 0x7));
            return -1;
        }
    }
    if ((bit_offset & 0x7) || bit_size != 8)
    {
        assert(bit_size_to_byte_size(bit_size) <= 1);
        *dst = 0;
        if (read_bits(cursor->product, bit_offset, bit_size, (uint8_t *)dst) != 0)
        {
            return -1;
        }
    }
    else
    {
        if (read_bytes(cursor->product, bit_offset >> 3, 1, dst) != 0)
        {
            return -1;
        }
    }

    return 0;
}